

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

int stbi_zlib_decode_buffer(char *obuffer,int olen,char *ibuffer,int ilen)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  stbi__zbuf a;
  char *in_stack_ffffffffffffefe8;
  stbi__zbuf *in_stack_ffffffffffffeff0;
  undefined4 local_1008;
  undefined4 local_4;
  
  iVar1 = stbi__do_zlib(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8,
                        (int)((ulong)(in_RDX + in_ECX) >> 0x20),(int)(in_RDX + in_ECX),
                        (int)((ulong)in_RDX >> 0x20));
  if (iVar1 == 0) {
    local_4 = -1;
  }
  else {
    local_4 = (int)in_stack_ffffffffffffeff0 - local_1008;
  }
  return local_4;
}

Assistant:

STBIDEF int stbi_zlib_decode_buffer(char *obuffer, int olen, char const *ibuffer, int ilen)
{
   stbi__zbuf a;
   a.zbuffer = (stbi_uc *) ibuffer;
   a.zbuffer_end = (stbi_uc *) ibuffer + ilen;
   if (stbi__do_zlib(&a, obuffer, olen, 0, 1))
      return (int) (a.zout - a.zout_start);
   else
      return -1;
}